

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderGLImpl::ShaderBuilder::HandleCompilingState
          (ShaderBuilder *this,bool WaitForCompletion)

{
  PFNGLGETSHADERIVPROC p_Var1;
  bool bVar2;
  GLuint GVar3;
  Char *pCVar4;
  State SVar5;
  char (*in_RCX) [28];
  undefined1 local_68 [8];
  string msg_1;
  GLint CompilationComplete;
  undefined1 local_38 [8];
  string msg;
  bool WaitForCompletion_local;
  ShaderBuilder *this_local;
  
  msg.field_2._M_local_buf[0xf] = WaitForCompletion;
  if (this->m_State != Compiling) {
    FormatString<char[26],char[28]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_State == State::Compiling",in_RCX);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [28])0x66;
    DebugAssertionFailed
              (pCVar4,"HandleCompilingState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
               ,0x66);
    std::__cxx11::string::~string((string *)local_38);
  }
  msg_1.field_2._8_4_ = 0;
  if ((msg.field_2._M_local_buf[0xf] & 1U) == 0) {
    if ((this->m_CreateAsynchronously & 1U) == 0) {
      FormatString<char[26],char[23]>
                ((string *)local_68,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_CreateAsynchronously",(char (*) [23])in_RCX);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"HandleCompilingState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
                 ,0x6b);
      std::__cxx11::string::~string((string *)local_68);
    }
    p_Var1 = __glewGetShaderiv;
    GVar3 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                      ((GLObjWrapper *)&this->m_Shader->m_GLShaderObj);
    (*p_Var1)(GVar3,0x91b1,(GLint *)(msg_1.field_2._M_local_buf + 8));
  }
  else {
    msg_1.field_2._8_4_ = 1;
  }
  if (msg_1.field_2._8_4_ != 0) {
    bVar2 = GetCompileStatus(this->m_Shader,this->m_ppCompilerOutput,
                             (bool)((this->m_CreateAsynchronously ^ 0xffU) & 1));
    SVar5 = Failed;
    if (bVar2) {
      SVar5 = Linking;
    }
    this->m_State = SVar5;
  }
  return;
}

Assistant:

void HandleCompilingState(bool WaitForCompletion)
    {
        VERIFY_EXPR(m_State == State::Compiling);

        GLint CompilationComplete = GL_FALSE;
        if (!WaitForCompletion)
        {
            VERIFY_EXPR(m_CreateAsynchronously);
            glGetShaderiv(m_Shader.m_GLShaderObj, GL_COMPLETION_STATUS_KHR, &CompilationComplete);
        }
        else
        {
            CompilationComplete = GL_TRUE;
        }

        if (CompilationComplete)
        {
            m_State = m_Shader.GetCompileStatus(m_ppCompilerOutput, /*ThrowOnError = */ !m_CreateAsynchronously) ? State::Linking : State::Failed;
        }
    }